

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barrier.hpp
# Opt level: O0

__pid_t __thiscall gmlc::concurrency::Barrier::wait(Barrier *this,void *__stat_loc)

{
  anon_class_16_2_3fe218ff __p;
  __pid_t extraout_EAX;
  size_t sVar1;
  size_t lGen;
  unique_lock<std::mutex> lck;
  Barrier *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&lGen,&this->mtx);
  sVar1 = this->count_ - 1;
  this->count_ = sVar1;
  if (sVar1 == 0) {
    this->generation_ = this->generation_ + 1;
    this->count_ = this->threshold_;
    std::condition_variable::notify_all();
  }
  else {
    __p.lGen = this->generation_;
    __p.this = this;
    std::condition_variable::wait<gmlc::concurrency::Barrier::wait()::_lambda()_1_>
              (&this->cv,(unique_lock<std::mutex> *)&lGen,__p);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&lGen);
  return extraout_EAX;
}

Assistant:

void wait()
        {
            std::unique_lock<std::mutex> lck(mtx);
            auto lGen = generation_;
            if (--count_ <= 0) {
                generation_++;
                count_ = threshold_;
                cv.notify_all();
            } else {
                cv.wait(lck, [this, lGen] { return lGen != generation_; });
            }
        }